

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

void __thiscall EncoderVelocityLocal::PrintFlags(EncoderVelocityLocal *this,ofstream *outFile)

{
  ostream *poVar1;
  string local_58;
  string local_38;
  
  if ((this->super_EncoderVelocity).velOverflow == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," VEL_OVF",8);
  }
  if ((this->super_EncoderVelocity).dirChange == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," DIR_CHG",8);
  }
  if ((this->super_EncoderVelocity).encError == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," ENC_ERR",8);
  }
  if ((this->super_EncoderVelocity).qtr1Overflow == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," Q1_OVF",7);
  }
  if ((this->super_EncoderVelocity).qtr5Overflow == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," Q5_OVF",7);
  }
  if ((this->super_EncoderVelocity).qtr1Edges != (this->super_EncoderVelocity).qtr5Edges) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," EDGES(",7);
    GetEdgeString_abi_cxx11_(&local_38,(this->super_EncoderVelocity).qtr1Edges);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)outFile,local_38._M_dataplus._M_p,local_38._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    GetEdgeString_abi_cxx11_(&local_58,(this->super_EncoderVelocity).qtr5Edges);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_EncoderVelocity).runOverflow == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)outFile," RUN_OVF",8);
  }
  return;
}

Assistant:

void EncoderVelocityLocal::PrintFlags(std::ofstream &outFile) const
{
    if (velOverflow)   outFile << " VEL_OVF";
    if (dirChange)     outFile << " DIR_CHG";
    if (encError)      outFile << " ENC_ERR";
    if (qtr1Overflow)  outFile << " Q1_OVF";
    if (qtr5Overflow)  outFile << " Q5_OVF";
    if (qtr1Edges!= qtr5Edges) {
        outFile << " EDGES(" << GetEdgeString(qtr1Edges)
                << ":" <<  GetEdgeString(qtr5Edges) << ")";
    }
    if (runOverflow) outFile << " RUN_OVF";
}